

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O3

void __thiscall CTPNStmWhile::gen_code(CTPNStmWhile *this,int param_1,int param_2)

{
  CTPNStmEnclosing *pCVar1;
  CTcPrsNode *pCVar2;
  CTPNStm *substm;
  CTcCodeLabel *lbl;
  CTcCodeLabel *lbl_00;
  
  CTPNStmBase::add_debug_line_rec((CTPNStmBase *)this);
  pCVar1 = G_cs->enclosing_;
  G_cs->enclosing_ = (CTPNStmEnclosing *)this;
  lbl = CTcPrsNode::new_label_here();
  lbl_00 = CTcCodeStream::new_label_fwd(G_cs);
  pCVar2 = (this->super_CTPNStmWhileBase).cond_expr_;
  (*(pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x14])(pCVar2,0,lbl_00);
  this->break_lbl_ = lbl_00;
  this->cont_lbl_ = lbl;
  substm = (this->super_CTPNStmWhileBase).body_stm_;
  if (substm != (CTPNStm *)0x0) {
    CTPNStmBase::gen_code_substm((CTPNStmBase *)this,substm);
  }
  CTcGenTarg::write_op(G_cg,0x91);
  CTcCodeStream::write_ofs(G_cs,lbl,0,0);
  CTcPrsNode::def_label_pos(lbl_00);
  G_cs->enclosing_ = pCVar1;
  return;
}

Assistant:

void CTPNStmWhile::gen_code(int, int)
{
    CTcCodeLabel *top_lbl;
    CTcCodeLabel *end_lbl;
    CTPNStmEnclosing *old_enclosing;

    /* add a line record */
    add_debug_line_rec();

    /* push the enclosing statement */
    old_enclosing = G_cs->set_enclosing(this);

    /* set the label for the top of the loop */
    top_lbl = new_label_here();

    /* generate a label for the end of the loop */
    end_lbl = G_cs->new_label_fwd();

    /* generate the condition, jumping to the end of the loop if false */
    cond_expr_->gen_code_cond(0, end_lbl);

    /* 
     *   set the 'break' and 'continue' label in our node, so that 'break'
     *   and 'continue' statements in subnodes can find the labels during
     *   code generation 
     */
    break_lbl_ = end_lbl;
    cont_lbl_ = top_lbl;

    /* if we have a body, generate it */
    if (body_stm_ != 0)
        gen_code_substm(body_stm_);

    /* 
     *   add another line record - the jump back to the top of the loop is
     *   part of the 'while' itself 
     */
//$$$    add_debug_line_rec();

    /* jump back to the top of the loop */
    G_cg->write_op(OPC_JMP);
    G_cs->write_ofs2(top_lbl, 0);

    /* 
     *   we're at the end of the loop - this is where we jump for 'break'
     *   and when the condition becomes false 
     */
    def_label_pos(end_lbl);

    /* restore the enclosing statement */
    G_cs->set_enclosing(old_enclosing);
}